

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O2

int __thiscall QLocalServer::listen(QLocalServer *this,int __fd,int __n)

{
  QLocalServerPrivate *this_00;
  int iVar1;
  int __n_00;
  QLocalServerPrivate *d;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalServerPrivate **)&this->field_0x8;
  if ((this_00->serverName).d.size == 0) {
    QString::clear(&this_00->serverName);
    QString::clear(&this_00->fullServerName);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar1 = QLocalServerPrivate::listen(this_00,__fd,__n_00);
      return iVar1;
    }
  }
  else {
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_20 = "default";
    QMessageLogger::warning(local_38,"QLocalServer::listen() called when already listening");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return 0;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalServer::listen(qintptr socketDescriptor)
{
    Q_D(QLocalServer);
    if (isListening()) {
        qWarning("QLocalServer::listen() called when already listening");
        return false;
    }

    d->serverName.clear();
    d->fullServerName.clear();

    if (!d->listen(socketDescriptor)) {
        return false;
    }

    return true;
}